

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sopr.cc
# Opt level: O0

void anon_unknown.dwarf_2333::PrintTypeErrorMessage(char *option)

{
  ostream *poVar1;
  char *in_RDI;
  ostringstream *in_stack_00000018;
  string *in_stack_00000020;
  ostringstream error_message;
  allocator local_1b1;
  string local_1b0 [48];
  ostringstream local_180 [376];
  char *local_8;
  
  local_8 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_180);
  poVar1 = std::operator<<((ostream *)local_180,"The argument for the -");
  poVar1 = std::operator<<(poVar1,local_8);
  std::operator<<(poVar1," option must be numeric");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"sopr",&local_1b1);
  sptk::PrintErrorMessage(in_stack_00000020,in_stack_00000018);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void PrintTypeErrorMessage(const char* option) {
  std::ostringstream error_message;
  error_message << "The argument for the -" << option
                << " option must be numeric";
  sptk::PrintErrorMessage("sopr", error_message);
}